

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::EventLogEntry_ParseRest
               (EventLogEntry *evt,EventLogEntryVTableEntry *evtFPVTable,
               ThreadContext *threadContext,FileReader *reader,UnlinkableSlabAllocator *alloc)

{
  int32 iVar1;
  int64 iVar2;
  
  iVar1 = FileReader::ReadInt32(reader,eventResultStatus,true);
  evt->ResultStatus = iVar1;
  iVar2 = FileReader::ReadInt64(reader,eventTime,true);
  evt->EventTimeStamp = iVar2;
  if (evtFPVTable[evt->EventKind].ParseFP != (fPtr_EventLogEntryInfoParse)0x0) {
    (*evtFPVTable[evt->EventKind].ParseFP)(evt,threadContext,reader,alloc);
  }
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void EventLogEntry_ParseRest(EventLogEntry* evt, EventLogEntryVTableEntry* evtFPVTable, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            evt->ResultStatus = reader->ReadInt32(NSTokens::Key::eventResultStatus, true);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            evt->EventTimeStamp = reader->ReadInt64(NSTokens::Key::eventTime, true);
#endif

            auto parseFP = evtFPVTable[(uint32)evt->EventKind].ParseFP;
            if(parseFP != nullptr)
            {
                parseFP(evt, threadContext, reader, alloc);
            }

            reader->ReadRecordEnd();
        }